

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,i64 n,u8 enc,_func_void_void_ptr *xDel)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  sqlite3 *db;
  int iVar4;
  int iVar5;
  size_t sVar6;
  u8 uVar7;
  u16 uVar8;
  byte bVar9;
  long lVar10;
  size_t __n;
  uint uVar11;
  
  if (z == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    iVar4 = 0;
  }
  else {
    db = pMem->db;
    if (db == (sqlite3 *)0x0) {
      lVar10 = 1000000000;
    }
    else {
      lVar10 = (long)db->aLimit[0];
    }
    bVar9 = enc;
    if (n < 0) {
      if (enc == '\x01') {
        sVar6 = strlen(z);
        bVar9 = 1;
        uVar8 = 0x202;
      }
      else {
        for (sVar6 = 0;
            (uVar8 = 0x202, (long)sVar6 <= lVar10 && (z[sVar6 + 1] != '\0' || z[sVar6] != '\0'));
            sVar6 = sVar6 + 2) {
        }
      }
    }
    else {
      bVar9 = 1;
      if (1 < enc) {
        bVar9 = enc;
      }
      sVar6 = n;
      uVar8 = 2;
      if (enc == '\0') {
        uVar8 = 0x10;
      }
    }
    if (lVar10 < (long)sVar6) {
      if ((code *)0x1 < xDel + 1) {
        if (xDel == sqlite3OomClear) {
          sqlite3DbFreeNN(db,z);
        }
        else {
          (*xDel)(z);
        }
      }
      sqlite3VdbeMemSetNull(pMem);
      sqlite3ErrorToParser(pMem->db,0x12);
      iVar4 = 0x12;
    }
    else {
      if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
        lVar10 = 0;
        if (n < 0) {
          lVar10 = (ulong)(bVar9 != 1) + 1;
        }
        __n = lVar10 + sVar6;
        iVar4 = 0x20;
        if (0x20 < (long)__n) {
          iVar4 = (int)__n;
        }
        iVar4 = sqlite3VdbeMemClearAndResize(pMem,iVar4);
        if (iVar4 != 0) {
          return 7;
        }
        memcpy(pMem->z,z,__n);
      }
      else {
        sqlite3VdbeMemRelease(pMem);
        pMem->z = z;
        if (xDel == sqlite3OomClear) {
          pMem->zMalloc = z;
          iVar4 = sqlite3DbMallocSize(pMem->db,z);
          pMem->szMalloc = iVar4;
        }
        else {
          pMem->xDel = xDel;
          uVar8 = (ushort)(xDel == (_func_void_void_ptr *)0x0) * 0x1000 + uVar8 + 0x1000;
        }
      }
      uVar11 = (uint)sVar6 & 0x7fffffff;
      pMem->n = uVar11;
      pMem->flags = uVar8;
      pMem->enc = bVar9;
      iVar4 = 0;
      if ((1 < bVar9) && (iVar4 = 0, 1 < uVar11)) {
        cVar2 = *pMem->z;
        cVar3 = pMem->z[1];
        uVar7 = '\x02';
        if ((cVar3 == -2 && cVar2 == -1) || (uVar7 = '\x03', cVar3 == -1 && cVar2 == -2)) {
          iVar5 = sqlite3VdbeMemMakeWriteable(pMem);
          iVar4 = 7;
          if (iVar5 == 0) {
            sVar6 = (long)pMem->n - 2;
            pMem->n = (int)sVar6;
            memmove(pMem->z,pMem->z + 2,sVar6);
            iVar4 = 0;
            pMem->z[pMem->n] = '\0';
            pMem->z[(long)pMem->n + 1] = '\0';
            pbVar1 = (byte *)((long)&pMem->flags + 1);
            *pbVar1 = *pbVar1 | 2;
            pMem->enc = uVar7;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  i64 n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  i64 nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags;          /* New value for pMem->flags */

  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( enc!=0 || n>=0 );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = strlen(z);
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags= MEM_Str|MEM_Term;
  }else if( enc==0 ){
    flags = MEM_Blob;
    enc = SQLITE_UTF8;
  }else{
    flags = MEM_Str;
  }
  if( nByte>iLimit ){
    if( xDel && xDel!=SQLITE_TRANSIENT ){
      if( xDel==SQLITE_DYNAMIC ){
        sqlite3DbFree(pMem->db, (void*)z);
      }else{
        xDel((void*)z);
      }
    }
    sqlite3VdbeMemSetNull(pMem);
    return sqlite3ErrorToParser(pMem->db, SQLITE_TOOBIG);
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    i64 nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, (int)MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    if( xDel==SQLITE_DYNAMIC ){
      pMem->zMalloc = pMem->z;
      pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
    }else{
      pMem->xDel = xDel;
      flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
    }
  }

  pMem->n = (int)(nByte & 0x7fffffff);
  pMem->flags = flags;
  pMem->enc = enc;

#ifndef SQLITE_OMIT_UTF16
  if( enc>SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif


  return SQLITE_OK;
}